

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

string * __thiscall
cmState::Snapshot::GetExecutionListFile_abi_cxx11_(string *__return_storage_ptr__,Snapshot *this)

{
  pointer pcVar1;
  PointerType pSVar2;
  ReferenceType pbVar3;
  
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pbVar3 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::iterator::operator*(&pSVar2->ExecutionListFile);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pbVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar3->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmState::Snapshot::GetExecutionListFile() const
{
  return *this->Position->ExecutionListFile;
}